

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O3

void __thiscall ncnn::PoolAllocator::clear(PoolAllocator *this)

{
  _List_node_base *p_Var1;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->budgets_lock);
  for (p_Var1 = (this->budgets).
                super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->budgets; p_Var1 = p_Var1->_M_next) {
    if (p_Var1[1]._M_prev != (_List_node_base *)0x0) {
      free(p_Var1[1]._M_prev);
    }
  }
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::clear
            (&this->budgets);
  pthread_mutex_unlock((pthread_mutex_t *)&this->budgets_lock);
  return;
}

Assistant:

void PoolAllocator::clear()
{
    budgets_lock.lock();

    std::list< std::pair<size_t, void*> >::iterator it = budgets.begin();
    for (; it != budgets.end(); it++)
    {
        void* ptr = it->second;
        ncnn::fastFree(ptr);
    }
    budgets.clear();

    budgets_lock.unlock();
}